

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename)

{
  pointer pcVar1;
  StringOutputStream *this_00;
  
  *(undefined ***)this = &PTR__MemoryOutputStream_00199938;
  this->directory_ = directory;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  (this->insertion_point_)._M_dataplus._M_p = (pointer)&(this->insertion_point_).field_2;
  (this->insertion_point_)._M_string_length = 0;
  (this->insertion_point_).field_2._M_local_buf[0] = '\0';
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this_00 = (StringOutputStream *)operator_new(0x10);
  google::protobuf::io::StringOutputStream::StringOutputStream(this_00,(string *)&this->data_);
  (this->inner_).ptr_ = this_00;
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const string& filename)
    : directory_(directory),
      filename_(filename),
      inner_(new io::StringOutputStream(&data_)) {
}